

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_builtin_variables(CompilerHLSL *this)

{
  ParsedIR *this_00;
  uint uVar1;
  BaseType BVar2;
  TypedID<(spirv_cross::Types)3> *pTVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  BaseType BVar6;
  uint32_t uVar7;
  TypedID<(spirv_cross::Types)0> *pTVar8;
  SPIRVariable *var;
  SPIRType *pSVar9;
  SPIRConstant *pSVar10;
  mapped_type *pmVar11;
  BaseType BVar12;
  uint *in_RCX;
  uint *puVar13;
  BaseType *pBVar14;
  __node_base *p_Var15;
  TypedID<(spirv_cross::Types)0> *id;
  TypedID<(spirv_cross::Types)0> *pTVar16;
  long lVar17;
  uint32_t i;
  uint *puVar18;
  uint32_t i_1;
  ulong uVar19;
  long lVar20;
  BaseType sample_mask_out_basetype;
  BaseType sample_mask_in_basetype;
  undefined1 local_118 [32];
  string binding_info;
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>_>
  builtin_to_initializer;
  Bitset builtins;
  
  Bitset::Bitset(&builtins,&(this->super_CompilerGLSL).super_Compiler.active_input_builtins);
  Bitset::merge_or(&builtins,&(this->super_CompilerGLSL).super_Compiler.active_output_builtins);
  builtin_to_initializer._M_h._M_buckets = &builtin_to_initializer._M_h._M_single_bucket;
  builtin_to_initializer._M_h._M_bucket_count = 1;
  builtin_to_initializer._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  builtin_to_initializer._M_h._M_element_count = 0;
  builtin_to_initializer._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  builtin_to_initializer._M_h._M_rehash_policy._M_next_resize = 0;
  builtin_to_initializer._M_h._M_single_bucket = (__node_base_ptr)0x0;
  sample_mask_out_basetype = Void;
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  sample_mask_in_basetype = sample_mask_out_basetype;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar16 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  pTVar8 = pTVar16 + (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  do {
    if (pTVar16 == pTVar8) {
      ParsedIR::LoopLock::~LoopLock((LoopLock *)&binding_info);
      local_118._0_8_ = &builtin_to_initializer;
      local_118._16_8_ = &sample_mask_in_basetype;
      local_118._24_8_ = &sample_mask_out_basetype;
      local_118._8_8_ = this;
      for (uVar19 = 0; uVar19 != 0x40; uVar19 = uVar19 + 1) {
        if ((builtins.lower >> (uVar19 & 0x3f) & 1) != 0) {
          emit_builtin_variables::anon_class_32_4_fdb8fe48::operator()
                    ((anon_class_32_4_fdb8fe48 *)local_118,(uint32_t)uVar19);
        }
      }
      if (builtins.higher._M_h._M_element_count != 0) {
        binding_info._M_dataplus._M_p = (pointer)((long)&binding_info.field_2 + 8);
        binding_info._M_string_length = 0;
        binding_info.field_2._M_allocated_capacity = 8;
        SmallVector<unsigned_int,_8UL>::reserve
                  ((SmallVector<unsigned_int,_8UL> *)&binding_info,
                   builtins.higher._M_h._M_element_count);
        p_Var15 = &builtins.higher._M_h._M_before_begin;
        while (p_Var15 = p_Var15->_M_nxt, p_Var15 != (__node_base *)0x0) {
          SmallVector<unsigned_int,_8UL>::push_back
                    ((SmallVector<unsigned_int,_8UL> *)&binding_info,(uint *)(p_Var15 + 1));
        }
        ::std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                  (binding_info._M_dataplus._M_p,
                   binding_info._M_dataplus._M_p + binding_info._M_string_length * 4);
        _Var4 = binding_info._M_dataplus;
        lVar20 = binding_info._M_string_length << 2;
        for (lVar17 = 0; lVar20 != lVar17; lVar17 = lVar17 + 4) {
          emit_builtin_variables::anon_class_32_4_fdb8fe48::operator()
                    ((anon_class_32_4_fdb8fe48 *)local_118,*(uint32_t *)(_Var4._M_p + lVar17));
        }
        SmallVector<unsigned_int,_8UL>::~SmallVector
                  ((SmallVector<unsigned_int,_8UL> *)&binding_info);
      }
      if (((this->base_vertex_info).used == true) && ((this->hlsl_options).shader_model < 0x44)) {
        binding_info._M_dataplus._M_p = (pointer)&binding_info.field_2;
        binding_info._M_string_length = 0;
        binding_info.field_2._M_allocated_capacity =
             binding_info.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if ((this->base_vertex_info).explicit_binding == true) {
          join<char_const(&)[14],unsigned_int&>
                    ((string *)local_118,(spirv_cross *)" : register(b",
                     (char (*) [14])&this->base_vertex_info,in_RCX);
          ::std::__cxx11::string::operator=((string *)&binding_info,(string *)local_118);
          ::std::__cxx11::string::~string((string *)local_118);
          if ((this->base_vertex_info).register_space != 0) {
            join<char_const(&)[8],unsigned_int&>
                      ((string *)local_118,(spirv_cross *)", space",
                       (char (*) [8])&(this->base_vertex_info).register_space,in_RCX);
            ::std::__cxx11::string::append((string *)&binding_info);
            ::std::__cxx11::string::~string((string *)local_118);
          }
          ::std::__cxx11::string::append((char *)&binding_info);
        }
        CompilerGLSL::statement<char_const(&)[31],std::__cxx11::string&>
                  (&this->super_CompilerGLSL,(char (*) [31])"cbuffer SPIRV_Cross_VertexInfo",
                   &binding_info);
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[28]>
                  (&this->super_CompilerGLSL,(char (*) [28])0x27f242);
        CompilerGLSL::statement<char_const(&)[30]>
                  (&this->super_CompilerGLSL,(char (*) [30])0x27f1ec);
        CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x272bdf);
        ::std::__cxx11::string::~string((string *)&binding_info);
      }
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&builtin_to_initializer._M_h);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&builtins.higher._M_h);
      return;
    }
    uVar1 = pTVar16->id;
    in_RCX = (uint *)((ulong)uVar1 * 0x18);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [uVar1].type == TypeVariable) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,uVar1);
      bVar5 = Compiler::is_builtin_variable((Compiler *)this,var);
      if (bVar5) {
        pSVar9 = Compiler::get<spirv_cross::SPIRType>
                           ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
        BVar6 = Compiler::get_decoration
                          ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
        BVar2 = var->storage;
        pBVar14 = &sample_mask_in_basetype;
        if (BVar2 == Void && (BVar6 ^ RayQuery) == Unknown) {
LAB_0018e89f:
          BVar12 = pSVar9->basetype;
          *pBVar14 = BVar12;
        }
        else {
          BVar12 = BVar6 ^ RayQuery | BVar2 ^ SByte;
          pBVar14 = &sample_mask_out_basetype;
          if (BVar12 == Unknown) goto LAB_0018e89f;
        }
        uVar7 = (var->initializer).id;
        in_RCX = (uint *)(ulong)CONCAT31((int3)(BVar12 >> 8),uVar7 == 0);
        if (BVar2 == SByte && uVar7 != 0) {
          pSVar10 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar7);
          if (pSVar10 != (SPIRConstant *)0x0) {
            if (pSVar9->basetype == Struct) {
              puVar13 = (uint *)(ulong)(uint)(pSVar9->member_types).
                                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                             .buffer_size;
              in_RCX = puVar13;
              for (puVar18 = (uint *)0x0; puVar13 != puVar18; puVar18 = (uint *)((long)puVar18 + 1))
              {
                in_RCX = (uint *)0xb;
                bVar5 = Compiler::has_member_decoration
                                  ((Compiler *)this,(TypeID)(pSVar9->super_IVariant).self.id,
                                   (uint32_t)puVar18,DecorationBuiltIn);
                if (bVar5) {
                  pTVar3 = (pSVar10->subconstants).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr;
                  uVar7 = Compiler::get_member_decoration
                                    ((Compiler *)this,(TypeID)(pSVar9->super_IVariant).self.id,
                                     (uint32_t)puVar18,DecorationBuiltIn);
                  local_118._0_4_ = uVar7;
                  pmVar11 = ::std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&builtin_to_initializer,(key_type *)local_118);
                  uVar1 = pTVar3[(long)puVar18].id;
                  in_RCX = (uint *)(ulong)uVar1;
                  pmVar11->id = uVar1;
                }
              }
            }
            else {
              bVar5 = Compiler::has_decoration
                                ((Compiler *)this,(ID)(var->super_IVariant).self.id,
                                 DecorationBuiltIn);
              if (bVar5) {
                local_118._0_4_ = BVar6;
                pmVar11 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&builtin_to_initializer,(key_type *)local_118);
                uVar1 = (var->initializer).id;
                in_RCX = (uint *)(ulong)uVar1;
                pmVar11->id = uVar1;
              }
            }
          }
        }
      }
    }
    pTVar16 = pTVar16 + 1;
  } while( true );
}

Assistant:

void CompilerHLSL::emit_builtin_variables()
{
	Bitset builtins = active_input_builtins;
	builtins.merge_or(active_output_builtins);

	std::unordered_map<uint32_t, ID> builtin_to_initializer;

	// We need to declare sample mask with the same type that module declares it.
	// Sample mask is somewhat special in that SPIR-V has an array, and we can copy that array, so we need to
	// match sign.
	SPIRType::BaseType sample_mask_in_basetype = SPIRType::Void;
	SPIRType::BaseType sample_mask_out_basetype = SPIRType::Void;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (!is_builtin_variable(var))
			return;

		auto &type = this->get<SPIRType>(var.basetype);
		auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));

		if (var.storage == StorageClassInput && builtin == BuiltInSampleMask)
			sample_mask_in_basetype = type.basetype;
		else if (var.storage == StorageClassOutput && builtin == BuiltInSampleMask)
			sample_mask_out_basetype = type.basetype;

		if (var.initializer && var.storage == StorageClassOutput)
		{
			auto *c = this->maybe_get<SPIRConstant>(var.initializer);
			if (!c)
				return;

			if (type.basetype == SPIRType::Struct)
			{
				uint32_t member_count = uint32_t(type.member_types.size());
				for (uint32_t i = 0; i < member_count; i++)
				{
					if (has_member_decoration(type.self, i, DecorationBuiltIn))
					{
						builtin_to_initializer[get_member_decoration(type.self, i, DecorationBuiltIn)] =
								c->subconstants[i];
					}
				}
			}
			else if (has_decoration(var.self, DecorationBuiltIn))
			{
				builtin_to_initializer[builtin] = var.initializer;
			}
		}
	});

	// Emit global variables for the interface variables which are statically used by the shader.
	builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		uint32_t array_size = 0;

		string init_expr;
		auto init_itr = builtin_to_initializer.find(builtin);
		if (init_itr != builtin_to_initializer.end())
			init_expr = join(" = ", to_expression(init_itr->second));

		if (get_execution_model() == ExecutionModelMeshEXT)
		{
			if (builtin == BuiltInPosition || builtin == BuiltInPointSize || builtin == BuiltInClipDistance ||
			    builtin == BuiltInCullDistance || builtin == BuiltInLayer || builtin == BuiltInPrimitiveId ||
			    builtin == BuiltInViewportIndex || builtin == BuiltInCullPrimitiveEXT ||
			    builtin == BuiltInPrimitiveShadingRateKHR || builtin == BuiltInPrimitivePointIndicesEXT ||
			    builtin == BuiltInPrimitiveLineIndicesEXT || builtin == BuiltInPrimitiveTriangleIndicesEXT)
			{
				return;
			}
		}

		switch (builtin)
		{
		case BuiltInFragCoord:
		case BuiltInPosition:
			type = "float4";
			break;

		case BuiltInFragDepth:
			type = "float";
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
		case BuiltInInstanceIndex:
			type = "int";
			if (hlsl_options.support_nonzero_base_vertex_base_instance || hlsl_options.shader_model >= 68)
				base_vertex_info.used = true;
			break;

		case BuiltInBaseVertex:
		case BuiltInBaseInstance:
			type = "int";
			base_vertex_info.used = true;
			break;

		case BuiltInInstanceId:
		case BuiltInSampleId:
			type = "int";
			break;

		case BuiltInPointSize:
			if (hlsl_options.point_size_compat || hlsl_options.shader_model <= 30)
			{
				// Just emit the global variable, it will be ignored.
				type = "float";
				break;
			}
			else
				SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));

		case BuiltInGlobalInvocationId:
		case BuiltInLocalInvocationId:
		case BuiltInWorkgroupId:
			type = "uint3";
			break;

		case BuiltInLocalInvocationIndex:
			type = "uint";
			break;

		case BuiltInFrontFacing:
			type = "bool";
			break;

		case BuiltInNumWorkgroups:
		case BuiltInPointCoord:
			// Handled specially.
			break;

		case BuiltInSubgroupLocalInvocationId:
		case BuiltInSubgroupSize:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			break;

		case BuiltInSubgroupEqMask:
		case BuiltInSubgroupLtMask:
		case BuiltInSubgroupLeMask:
		case BuiltInSubgroupGtMask:
		case BuiltInSubgroupGeMask:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			type = "uint4";
			break;

		case BuiltInHelperInvocation:
			if (hlsl_options.shader_model < 50)
				SPIRV_CROSS_THROW("Need SM 5.0 for Helper Invocation.");
			break;

		case BuiltInClipDistance:
			array_size = clip_distance_count;
			type = "float";
			break;

		case BuiltInCullDistance:
			array_size = cull_distance_count;
			type = "float";
			break;

		case BuiltInSampleMask:
			if (active_input_builtins.get(BuiltInSampleMask))
				type = sample_mask_in_basetype == SPIRType::UInt ? "uint" : "int";
			else
				type = sample_mask_out_basetype == SPIRType::UInt ? "uint" : "int";
			array_size = 1;
			break;

		case BuiltInPrimitiveId:
		case BuiltInViewIndex:
		case BuiltInLayer:
			type = "uint";
			break;

		case BuiltInViewportIndex:
		case BuiltInPrimitiveShadingRateKHR:
		case BuiltInPrimitiveLineIndicesEXT:
		case BuiltInCullPrimitiveEXT:
			type = "uint";
			break;

		case BuiltInBaryCoordKHR:
		case BuiltInBaryCoordNoPerspKHR:
			if (hlsl_options.shader_model < 61)
				SPIRV_CROSS_THROW("Need SM 6.1 for barycentrics.");
			type = "float3";
			break;

		default:
			SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));
		}

		StorageClass storage = active_input_builtins.get(i) ? StorageClassInput : StorageClassOutput;

		if (type)
		{
			if (array_size)
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), "[", array_size, "]", init_expr, ";");
			else
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), init_expr, ";");
		}

		// SampleMask can be both in and out with sample builtin, in this case we have already
		// declared the input variable and we need to add the output one now.
		if (builtin == BuiltInSampleMask && storage == StorageClassInput && this->active_output_builtins.get(i))
		{
			type = sample_mask_out_basetype == SPIRType::UInt ? "uint" : "int";
			if (array_size)
				statement("static ", type, " ", this->builtin_to_glsl(builtin, StorageClassOutput), "[", array_size, "]", init_expr, ";");
			else
				statement("static ", type, " ", this->builtin_to_glsl(builtin, StorageClassOutput), init_expr, ";");
		}
	});

	if (base_vertex_info.used && hlsl_options.shader_model < 68)
	{
		string binding_info;
		if (base_vertex_info.explicit_binding)
		{
			binding_info = join(" : register(b", base_vertex_info.register_index);
			if (base_vertex_info.register_space)
				binding_info += join(", space", base_vertex_info.register_space);
			binding_info += ")";
		}
		statement("cbuffer SPIRV_Cross_VertexInfo", binding_info);
		begin_scope();
		statement("int SPIRV_Cross_BaseVertex;");
		statement("int SPIRV_Cross_BaseInstance;");
		end_scope_decl();
		statement("");
	}
}